

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  uint uVar5;
  byte bVar6;
  undefined8 *__s;
  void *pvVar7;
  long lVar8;
  void *__s_00;
  ostream *poVar9;
  pointer pvVar10;
  int j;
  long lVar11;
  int iVar12;
  int i;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  ofstream file;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_248;
  value_type local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_248.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (undefined8 *)operator_new(0xc0);
  memset(__s,0,0xc0);
  pvVar7 = operator_new(0xc0);
  lVar8 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar7 + lVar8 * 8);
    *puVar1 = 0x4069000000000000;
    puVar1[1] = 0x4069000000000000;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 0x18);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&local_248,0x18);
  lVar8 = 0;
  do {
    local_230 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((local_248.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar8),0x18,&local_230);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x240);
  lVar8 = 0;
  pvVar10 = local_248.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar5 = (uint)lVar8;
    bVar6 = (byte)((uVar5 & 0xff) / 3) & 0xfe;
    if ((((char)lVar8 != (byte)(bVar6 * '\x03')) && ((byte)((char)lVar8 + bVar6 * -3) != '\x05')) &&
       ((0x17 < uVar5 || ((0xfc003fU >> (uVar5 & 0x1f) & 1) == 0)))) {
      pdVar3 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[lVar8 + -1] = 0.25;
      pdVar3[lVar8 + 1] = 0.25;
      pdVar3[lVar8 + -6] = 0.25;
      pdVar3[lVar8 + 6] = 0.25;
    }
    lVar8 = lVar8 + 1;
    pvVar10 = pvVar10 + 1;
  } while (lVar8 != 0x18);
  pdVar3 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xb].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[5] = 0.24141630919814847;
  pdVar3[0x11] = 0.24141630919814847;
  pdVar3[10] = 0.48283261839629693;
  __s[0xb] = 0x3feb77c26ee95ecb;
  pdVar4 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x11].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar4[0xb] = pdVar3[5];
  pdVar4[0x17] = pdVar3[0x11];
  pdVar4[0x10] = pdVar3[10];
  __s[0x11] = __s[0xb];
  pdVar3 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *pdVar3 = 0.25;
  pdVar3[0xc] = 0.25;
  pdVar3[7] = 0.5;
  pdVar3 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xc].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[6] = 0.25;
  pdVar3[0x12] = 0.25;
  pdVar3[0xd] = 0.5;
  *__s = 0x4069000000000000;
  __s[1] = 0x4069000000000000;
  __s[2] = 0x4069000000000000;
  __s[3] = 0x4069000000000000;
  __s[4] = 0x4069000000000000;
  __s[5] = 0x4069000000000000;
  pvVar10 = local_248.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 0x13;
  lVar8 = 0x14;
  do {
    pdVar3 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[lVar8 + -7] = 0.5;
    pdVar3[lVar8 + -2] = 0.25;
    pdVar3[lVar8] = 0.25;
    __s[lVar8 + -1] = 0x3ff555554d555555;
    pvVar10 = pvVar10 + 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x18);
  pdVar3 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x12].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[0xc] = 0.5;
  pdVar3[0x13] = 0.5;
  __s[0x12] = 0x3ff555554d555555;
  pdVar3 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x17].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[0x16] = 0.48283261839629693;
  pdVar3[0x11] = 0.48283261839629693;
  __s[0x17] = 0x40012ad98551db3f;
  __s_00 = operator_new(0xc0);
  lVar8 = 0;
  memset(__s_00,0,0xc0);
  dVar14 = 0.0;
  do {
    do {
      dVar15 = *(double *)((long)pvVar7 + lVar8 * 8);
      *(double *)((long)__s_00 + lVar8 * 8) = dVar15;
      *(undefined8 *)((long)pvVar7 + lVar8 * 8) = 0;
      pdVar3 = local_248.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar8].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar11 = 0;
      dVar16 = 0.0;
      do {
        dVar16 = dVar16 + pdVar3[lVar11] * *(double *)((long)__s_00 + lVar11 * 8);
        *(double *)((long)pvVar7 + lVar8 * 8) = dVar16;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x18);
      dVar2 = (double)__s[lVar8];
      *(double *)((long)pvVar7 + lVar8 * 8) = dVar16 + dVar2;
      dVar15 = ABS(dVar15 - (dVar16 + dVar2));
      if (dVar15 <= dVar14) {
        dVar15 = dVar14;
      }
      lVar8 = lVar8 + 1;
      dVar14 = dVar15;
    } while (lVar8 != 0x18);
    lVar8 = 0;
    dVar14 = 0.0;
  } while (0.0001 < dVar15);
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x102058);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# X Y Z\n",8);
  iVar12 = 0;
  uVar13 = 0;
  do {
    poVar9 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&local_230,iVar12 + (int)((uVar13 & 0xffffffff) / 6) * -0x1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(((uint)uVar13 & 0xff) / 6) * 0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::ostream::_M_insert<double>(*(double *)((long)pvVar7 + uVar13 * 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    uVar13 = uVar13 + 1;
    iVar12 = iVar12 + 0x50;
  } while (uVar13 != 0x18);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)((long)_VTT + -0x18) + -8) = ___cxa_atexit;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  operator_delete(__s_00);
  operator_delete(pvVar7);
  operator_delete(__s);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_248);
  return 0;
}

Assistant:

int main(){
  double dx = 0.08f, dy = 0.08f;
  double h = 40.0f, t_f = 25.0f, lambda = 45.0f, q_w = 1500;

  std::vector<std::vector<double> > A;
  std::vector<double> c(24,0);
  std::vector<double> t(24,200);
  A.resize(24);
  for (int i=0;i<24;i++){
    A[i].resize(24,0);
  }

  // Inner points
  for (int i=0;i<24;i++){
    if ((i%6 == 0) || (i%6 == 5)) continue;
    if ((i/6 == 0) || (i/6 == 3)) continue;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    A[i][i-6] = 0.25f;
    A[i][i+6] = 0.25f;
  }

  // Convection
  double two_h_x_l = 2.0f * h * dx / lambda;
  A[11][5] = 1.0f / (4.0f + two_h_x_l);
  A[11][17] = A[11][5];
  A[11][10] = 2 * A[11][5];
  c[11] = two_h_x_l / (4.0f + two_h_x_l) * t_f;
  A[17][11] = A[11][5];
  A[17][23] = A[11][17];
  A[17][16] = A[11][10];
  c[17] = c[11];

  // Insulation
  A[6][0] = 0.25f;
  A[6][12] = 0.25f;
  A[6][7] = 0.5f;
  A[12][6] = 0.25f;
  A[12][18] = 0.25f;
  A[12][13] = 0.5f;

  // I
  c[0] = 200.0f;
  c[1] = 200.0f;
  c[2] = 200.0f;
  c[3] = 200.0f;
  c[4] = 200.0f;
  c[5] = 200.0f;

  // II
  double temp = dx * q_w / lambda / 2;
  for (int i=19;i<23;i++){
    A[i][i-6] = 0.5f;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    c[i] = temp;
  }

  // half II + half iso
  A[18][12] = 0.5f;
  A[18][19] = 0.5f;
  c[18] = q_w * dx / lambda / 2;

  // half II + half III
  A[23][22] = 1.0f / (2.0 + h * dx / lambda);
  A[23][17] = A[23][22];
  c[23] = (q_w * dx / lambda + h * dx * t_f / lambda) / (2.0 + h * dx / lambda);


  // Gaussian Seidel Method
  std::vector<double> x_aux(24,0);
  double error;

  do {
    error = 0;
    for (int i=0;i<24;i++){
      x_aux[i] = t[i];
      t[i] = 0;
      for (int j=0;j<24;j++){
        t[i] += A[i][j] * x_aux[j];
      }
      t[i] += c[i];
      double temp = std::abs(x_aux[i] - t[i]);
      if (temp > error)
        error = temp;
    }
  } while (error>0.0001);

//  for (int i=0;i<24;i++){
//    std::cout<<t[i]<<" ";
//    if (i%6 == 5) std::cout<<std::endl;
//  }

  // To file
  std::ofstream file;
  file.open("data.dat");
  file<<"# X Y Z\n";
  for (int i=0;i<24;i++){
    file << i%6 * 80 << " " << i/6 * 80 << " " << t[i] << "\n";
  }
  file.close();

  return 0;
}